

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

int run_test_fork_fs_events_child_dir(void)

{
  _do_fork_fs_events_child(1);
  return 0;
}

Assistant:

TEST_IMPL(fork_fs_events_child_dir) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
#if defined(__APPLE__) || defined (__linux__)
  return _do_fork_fs_events_child(FS_TEST_DIR);
#else
  /* You can't spin up a cfrunloop thread on an apple platform
     and then fork. See
     http://objectivistc.tumblr.com/post/16187948939/you-must-exec-a-core-foundation-fork-safety-tale
  */
  return 0;
#endif
}